

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_pagehandle.cc
# Opt level: O3

RC __thiscall PF_PageHandle::GetData(PF_PageHandle *this,char **pData)

{
  if (this->pPageData != (char *)0x0) {
    *pData = this->pPageData;
    return 0;
  }
  return 7;
}

Assistant:

RC PF_PageHandle::GetData(char *&pData) const
{
  // Page must refer to a pinned page
  if (pPageData == NULL)
    return (PF_PAGEUNPINNED);

  // Set pData to point to page contents (after PF header)
  pData = pPageData;

  // Return ok
  return (0);
}